

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O0

bool __thiscall glob::glob::next(glob *this)

{
  int iVar1;
  pointer pgVar2;
  dirent *pdVar3;
  char *__pattern;
  glob *this_local;
  
  do {
    pgVar2 = std::unique_ptr<glob::glob_impl,_std::default_delete<glob::glob_impl>_>::operator->
                       (&this->impl_);
    pdVar3 = readdir((DIR *)pgVar2->dir);
    pgVar2 = std::unique_ptr<glob::glob_impl,_std::default_delete<glob::glob_impl>_>::operator->
                       (&this->impl_);
    pgVar2->dir_entry = (dirent *)pdVar3;
    if (pdVar3 == (dirent *)0x0) {
      return false;
    }
    std::unique_ptr<glob::glob_impl,_std::default_delete<glob::glob_impl>_>::operator->
              (&this->impl_);
    __pattern = (char *)std::__cxx11::string::c_str();
    pgVar2 = std::unique_ptr<glob::glob_impl,_std::default_delete<glob::glob_impl>_>::operator->
                       (&this->impl_);
    iVar1 = fnmatch(__pattern,pgVar2->dir_entry->d_name,0x16);
  } while (iVar1 != 0);
  return true;
}

Assistant:

bool glob::next()
{
#ifdef GLOB_WINDOWS
    impl_->has_next =
        FindNextFileA(impl_->find_handle, &impl_->find_data) != 0;
    return impl_->has_next;
#else
    while ((impl_->dir_entry = readdir(impl_->dir)) != nullptr) {
        if (!fnmatch(impl_->file_pattern.c_str(),
                    impl_->dir_entry->d_name,
                    FNM_CASEFOLD | FNM_NOESCAPE | FNM_PERIOD)) {
            return true;
        }
    }
    return false;
#endif
}